

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O0

vector<CNetAddr,_std::allocator<CNetAddr>_> *
LookupHost(string *name,uint nMaxSolutions,bool fAllowLookup,DNSLookupFn *dns_lookup_function)

{
  long lVar1;
  string_view str;
  bool bVar2;
  reference pvVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  __sv_type _Var4;
  string strHost;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
  *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffeb;
  uint in_stack_ffffffffffffffec;
  string *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar5 = in_RDI;
  this = in_R8;
  _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view(in_R8);
  __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)_Var4._M_str;
  str._M_str = (char *)pbVar5;
  str._M_len = (size_t)in_RDI;
  bVar2 = util::ContainsNoNUL(str);
  if (bVar2) {
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               in_stack_ffffffffffffff58);
    bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (in_stack_ffffffffffffff18);
    if (bVar2) {
      memset(in_RDI,0,0x18);
      std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
                ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff18);
    }
    else {
      pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               front((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      if (*pvVar3 == '[') {
        pvVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        if (*pvVar3 == ']') {
          in_stack_ffffffffffffff30 =
               (function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                *)&stack0xffffffffffffffd8;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                    (in_stack_ffffffffffffff18);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                    (in_RDI,(size_type)in_R8,(size_type)in_stack_ffffffffffffff30);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (this,__str);
          std::__cxx11::string::~string(in_stack_ffffffffffffff18);
        }
      }
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                  *)in_R8,in_stack_ffffffffffffff30);
      LookupIntern(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,
                   (bool)in_stack_ffffffffffffffeb,(DNSLookupFn *)in_stack_ffffffffffffffe0);
      std::
      function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
      ::~function((function<std::vector<CNetAddr,_std::allocator<CNetAddr>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool)>
                   *)in_stack_ffffffffffffff18);
    }
    std::__cxx11::string::~string(in_stack_ffffffffffffff18);
  }
  else {
    memset(in_RDI,0,0x18);
    std::vector<CNetAddr,_std::allocator<CNetAddr>_>::vector
              ((vector<CNetAddr,_std::allocator<CNetAddr>_> *)in_stack_ffffffffffffff18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (vector<CNetAddr,_std::allocator<CNetAddr>_> *)pbVar5;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<CNetAddr> LookupHost(const std::string& name, unsigned int nMaxSolutions, bool fAllowLookup, DNSLookupFn dns_lookup_function)
{
    if (!ContainsNoNUL(name)) return {};
    std::string strHost = name;
    if (strHost.empty()) return {};
    if (strHost.front() == '[' && strHost.back() == ']') {
        strHost = strHost.substr(1, strHost.size() - 2);
    }

    return LookupIntern(strHost, nMaxSolutions, fAllowLookup, dns_lookup_function);
}